

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uchar *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  uint local_34;
  
  pInfo->idxNum = 0;
  pInfo->estimatedCost = 5000000.0;
  if (0 < (long)pInfo->nConstraint) {
    puVar7 = &pInfo->aConstraint->usable;
    uVar8 = 0xffffffff;
    uVar2 = 0;
    uVar10 = 0;
    local_34 = 0xffffffff;
    uVar4 = 0xffffffff;
    uVar5 = 0xffffffff;
    do {
      if (*puVar7 == '\0') {
        if (puVar7[-1] == '@') {
          pInfo->idxNum = 0;
          pInfo->estimatedCost = 1e+50;
          pInfo->estimatedRows = 0x4000000000000;
          return 0;
        }
      }
      else {
        iVar6 = ((sqlite3_index_constraint *)(puVar7 + -5))->iColumn;
        if (iVar6 < 0) {
          bVar12 = true;
        }
        else {
          bVar12 = iVar6 == *(int *)&pVTab[2].pModule + 1;
        }
        bVar11 = puVar7[-1];
        uVar9 = (uint)uVar10;
        if ((((int)uVar8 < 0) && (bVar11 == 2)) && (bVar12)) {
          pInfo->idxNum = 1;
          pInfo->estimatedCost = 1.0;
          uVar2 = 1;
          uVar8 = uVar9;
LAB_001b8b9a:
          if (iVar6 == *(int *)&pVTab[2].pModule + 2) {
            uVar5 = uVar10 & 0xffffffff;
          }
          bVar11 = 2;
        }
        else {
          if (bVar11 == 2) goto LAB_001b8b9a;
          if (((bVar11 == 0x40) && (bVar11 = 0x40, -1 < iVar6)) &&
             (iVar6 <= *(int *)&pVTab[2].pModule)) {
            uVar2 = iVar6 + 2;
            pInfo->idxNum = uVar2;
            pInfo->estimatedCost = 2.0;
            uVar8 = uVar9;
          }
        }
        if (bVar12) {
          switch((uint)bVar11 << 0x1e | bVar11 - 4 >> 2) {
          case 0:
          case 7:
            uVar4 = uVar10 & 0xffffffff;
            break;
          case 1:
          case 3:
            local_34 = uVar9;
          }
        }
      }
      uVar10 = uVar10 + 1;
      puVar7 = puVar7 + 0xc;
    } while ((long)pInfo->nConstraint != uVar10);
    if (uVar2 == 1) {
      *(byte *)&pInfo->idxFlags = (byte)pInfo->idxFlags | 1;
      uVar2 = 1;
    }
    if ((int)uVar8 < 0) {
      iVar6 = 1;
    }
    else {
      psVar1 = pInfo->aConstraintUsage;
      psVar1[uVar8].argvIndex = 1;
      psVar1[uVar8].omit = '\x01';
      iVar6 = 2;
    }
    if (-1 < (int)uVar5) {
      uVar2 = uVar2 | 0x10000;
      pInfo->idxNum = uVar2;
      pInfo->aConstraintUsage[uVar5].argvIndex = iVar6;
      iVar6 = iVar6 + 1;
    }
    if (-1 < (int)uVar4) {
      uVar2 = uVar2 | 0x20000;
      pInfo->idxNum = uVar2;
      pInfo->aConstraintUsage[uVar4].argvIndex = iVar6;
      iVar6 = iVar6 + 1;
    }
    if (-1 < (int)local_34) {
      pInfo->idxNum = uVar2 | 0x40000;
      pInfo->aConstraintUsage[local_34].argvIndex = iVar6;
    }
  }
  if (pInfo->nOrderBy == 1) {
    iVar6 = pInfo->aOrderBy->iColumn;
    if ((iVar6 < 0) || (iVar6 == *(int *)&pVTab[2].pModule + 1)) {
      pcVar3 = "DESC";
      if (pInfo->aOrderBy->desc == '\0') {
        pcVar3 = "ASC";
      }
      pInfo->idxStr = pcVar3;
      pInfo->orderByConsumed = 1;
    }
  }
  return 0;
}

Assistant:

static int fts3BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts3Table *p = (Fts3Table *)pVTab;
  int i;                          /* Iterator variable */
  int iCons = -1;                 /* Index of constraint to use */

  int iLangidCons = -1;           /* Index of langid=x constraint, if present */
  int iDocidGe = -1;              /* Index of docid>=x constraint, if present */
  int iDocidLe = -1;              /* Index of docid<=x constraint, if present */
  int iIdx;

  /* By default use a full table scan. This is an expensive option,
  ** so search through the constraints to see if a more efficient 
  ** strategy is possible.
  */
  pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
  pInfo->estimatedCost = 5000000;
  for(i=0; i<pInfo->nConstraint; i++){
    int bDocid;                 /* True if this constraint is on docid */
    struct sqlite3_index_constraint *pCons = &pInfo->aConstraint[i];
    if( pCons->usable==0 ){
      if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH ){
        /* There exists an unusable MATCH constraint. This means that if
        ** the planner does elect to use the results of this call as part
        ** of the overall query plan the user will see an "unable to use
        ** function MATCH in the requested context" error. To discourage
        ** this, return a very high cost here.  */
        pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
        pInfo->estimatedCost = 1e50;
        fts3SetEstimatedRows(pInfo, ((sqlite3_int64)1) << 50);
        return SQLITE_OK;
      }
      continue;
    }

    bDocid = (pCons->iColumn<0 || pCons->iColumn==p->nColumn+1);

    /* A direct lookup on the rowid or docid column. Assign a cost of 1.0. */
    if( iCons<0 && pCons->op==SQLITE_INDEX_CONSTRAINT_EQ && bDocid ){
      pInfo->idxNum = FTS3_DOCID_SEARCH;
      pInfo->estimatedCost = 1.0;
      iCons = i;
    }

    /* A MATCH constraint. Use a full-text search.
    **
    ** If there is more than one MATCH constraint available, use the first
    ** one encountered. If there is both a MATCH constraint and a direct
    ** rowid/docid lookup, prefer the MATCH strategy. This is done even 
    ** though the rowid/docid lookup is faster than a MATCH query, selecting
    ** it would lead to an "unable to use function MATCH in the requested 
    ** context" error.
    */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH 
     && pCons->iColumn>=0 && pCons->iColumn<=p->nColumn
    ){
      pInfo->idxNum = FTS3_FULLTEXT_SEARCH + pCons->iColumn;
      pInfo->estimatedCost = 2.0;
      iCons = i;
    }

    /* Equality constraint on the langid column */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_EQ 
     && pCons->iColumn==p->nColumn + 2
    ){
      iLangidCons = i;
    }

    if( bDocid ){
      switch( pCons->op ){
        case SQLITE_INDEX_CONSTRAINT_GE:
        case SQLITE_INDEX_CONSTRAINT_GT:
          iDocidGe = i;
          break;

        case SQLITE_INDEX_CONSTRAINT_LE:
        case SQLITE_INDEX_CONSTRAINT_LT:
          iDocidLe = i;
          break;
      }
    }
  }

  /* If using a docid=? or rowid=? strategy, set the UNIQUE flag. */
  if( pInfo->idxNum==FTS3_DOCID_SEARCH ) fts3SetUniqueFlag(pInfo);

  iIdx = 1;
  if( iCons>=0 ){
    pInfo->aConstraintUsage[iCons].argvIndex = iIdx++;
    pInfo->aConstraintUsage[iCons].omit = 1;
  } 
  if( iLangidCons>=0 ){
    pInfo->idxNum |= FTS3_HAVE_LANGID;
    pInfo->aConstraintUsage[iLangidCons].argvIndex = iIdx++;
  } 
  if( iDocidGe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_GE;
    pInfo->aConstraintUsage[iDocidGe].argvIndex = iIdx++;
  } 
  if( iDocidLe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_LE;
    pInfo->aConstraintUsage[iDocidLe].argvIndex = iIdx++;
  } 

  /* Regardless of the strategy selected, FTS can deliver rows in rowid (or
  ** docid) order. Both ascending and descending are possible. 
  */
  if( pInfo->nOrderBy==1 ){
    struct sqlite3_index_orderby *pOrder = &pInfo->aOrderBy[0];
    if( pOrder->iColumn<0 || pOrder->iColumn==p->nColumn+1 ){
      if( pOrder->desc ){
        pInfo->idxStr = "DESC";
      }else{
        pInfo->idxStr = "ASC";
      }
      pInfo->orderByConsumed = 1;
    }
  }

  assert( p->pSegments==0 );
  return SQLITE_OK;
}